

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReportTemplateProcessor.hpp
# Opt level: O0

void benchmarks::ReportTemplateProcessor::
     Process<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,benchmarks::BenchmarkApp::Run(int,char**)::__2,benchmarks::BenchmarkApp::Run(int,char**)::__3>
               (multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
                *b,multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
                   *e,car_type *printer,proto_child0 *macroProcessor)

{
  bool bVar1;
  runtime_error *this;
  bool local_322;
  multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
  local_300;
  undefined1 local_2f0 [8];
  ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:259:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:260:7)>
  g;
  proto_child0 *macroProcessor_local;
  car_type *printer_local;
  multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
  *e_local;
  multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
  *b_local;
  
  g._param.f.
  super_function4<bool,_boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>_&,_const_boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>_&,_boost::spirit::context<boost::fusion::cons<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.functor._16_8_ = macroProcessor;
  ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/core/benchmarks/BenchmarkApp.cpp:259:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/core/benchmarks/BenchmarkApp.cpp:260:7)>
  ::ReportGrammar((ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:259:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:260:7)>
                   *)local_2f0,printer,macroProcessor);
  boost::spirit::
  multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
  ::multi_pass(&local_300,e);
  bVar1 = boost::spirit::qi::
          parse<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,benchmarks::ReportTemplateProcessor::ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,std::char_traits<char>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::buffering_input_iterator,boost::spirit::iterator_policies::split_std_deque>>,benchmarks::BenchmarkApp::Run(int,char**)::__2,benchmarks::BenchmarkApp::Run(int,char**)::__3>>
                    (b,&local_300,
                     (ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:259:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:260:7)>
                      *)local_2f0);
  local_322 = true;
  if (bVar1) {
    local_322 = boost::spirit::
                multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
                ::operator!=(b,e);
  }
  boost::spirit::
  multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_300);
  if (local_322 != false) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not parse report template!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/core/benchmarks/BenchmarkApp.cpp:259:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/core/benchmarks/BenchmarkApp.cpp:260:7)>
  ::~ReportGrammar((ReportGrammar<boost::spirit::multi_pass<std::istreambuf_iterator<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::buffering_input_iterator,_boost::spirit::iterator_policies::split_std_deque>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:259:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_src_benchmarks_core_benchmarks_BenchmarkApp_cpp:260:7)>
                    *)local_2f0);
  return;
}

Assistant:

static void Process(Iterator_ b, Iterator_ e, const Printer_& printer, const MacroProcessor_& macroProcessor)
		{
			ReportGrammar<Iterator_, Printer_, MacroProcessor_> g(printer, macroProcessor);
			if (!boost::spirit::qi::parse(b, e, g) || b != e)
				throw std::runtime_error("Could not parse report template!");
		}